

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::PlatformIsAppleSimulator(cmMakefile *this)

{
  _Rb_tree_header *p_Var1;
  AppleSDK AVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  initializer_list<cmMakefile::AppleSDK> __l;
  allocator_type local_4a;
  less<cmMakefile::AppleSDK> local_49;
  _Rb_tree<cmMakefile::AppleSDK,_cmMakefile::AppleSDK,_std::_Identity<cmMakefile::AppleSDK>,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  local_48;
  AppleSDK local_18 [4];
  
  local_18[0] = AppleTVSimulator;
  local_18[1] = IPhoneSimulator;
  local_18[2] = WatchSimulator;
  local_18[3] = XRSimulator;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::
  set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  ::set((set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
         *)&local_48,__l,&local_49,&local_4a);
  AVar2 = GetAppleSDKType(this);
  p_Var1 = &local_48._M_impl.super__Rb_tree_header;
  p_Var3 = &p_Var1->_M_header;
  for (; (_Rb_tree_header *)local_48._M_impl.super__Rb_tree_header._M_header._M_parent !=
         (_Rb_tree_header *)0x0;
      local_48._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&(local_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
           [(int)*(size_t *)(local_48._M_impl.super__Rb_tree_header._M_header._M_parent + 1) <
            (int)AVar2]) {
    if ((int)AVar2 <=
        (int)*(size_t *)(local_48._M_impl.super__Rb_tree_header._M_header._M_parent + 1)) {
      p_Var3 = local_48._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
  }
  p_Var4 = p_Var1;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var4 = (_Rb_tree_header *)p_Var3,
     (int)AVar2 < (int)((_Rb_tree_header *)p_Var3)->_M_node_count)) {
    p_Var4 = p_Var1;
  }
  std::
  _Rb_tree<cmMakefile::AppleSDK,_cmMakefile::AppleSDK,_std::_Identity<cmMakefile::AppleSDK>,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  ::~_Rb_tree(&local_48);
  return p_Var4 != p_Var1;
}

Assistant:

bool cmMakefile::PlatformIsAppleSimulator() const
{
  return std::set<AppleSDK>{
    AppleSDK::AppleTVSimulator,
    AppleSDK::IPhoneSimulator,
    AppleSDK::WatchSimulator,
    AppleSDK::XRSimulator,
  }
    .count(this->GetAppleSDKType());
}